

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdCreateConfidentialSighash
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,char *pubkey,
              char *redeem_script,int64_t value_satoshi,char *value_commitment,int sighash_type,
              bool sighash_anyone_can_pay,char **sighash)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  HashType hash_type_00;
  char *pcVar4;
  CfdException *pCVar5;
  Amount AVar6;
  allocator local_12b;
  allocator local_12a;
  ElementsTransactionApi api;
  string sighash_bytes;
  ConfidentialValue value;
  undefined1 local_b8 [32];
  ByteData key_data;
  Txid local_80;
  string local_60;
  SigHashType sighashtype;
  
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar3) {
    value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x72d;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
    cfd::core::logger::warn<>((CfdSourceLocation *)&value,"tx is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&value,"Failed to parameter. tx is null or empty.",
               (allocator *)&sighash_bytes);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x733;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
    cfd::core::logger::warn<>((CfdSourceLocation *)&value,"txid is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&value,"Failed to parameter. txid is null or empty.",
               (allocator *)&sighash_bytes);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (sighash == (char **)0x0) {
    value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x739;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
    cfd::core::logger::warn<>((CfdSourceLocation *)&value,"sighash is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&value,"Failed to parameter. sighash is null.",(allocator *)&sighash_bytes)
    ;
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  hash_type_00 = cfd::capi::ConvertHashToAddressType(hash_type);
  switch(hash_type_00) {
  case kP2sh:
    bVar2 = 1;
    break;
  case kP2wpkh:
    bVar2 = 0;
    bVar1 = 0;
    hash_type_00 = kP2pkh;
    goto LAB_0036b492;
  case kP2wsh:
  case 5:
    hash_type_00 = kP2wsh;
    bVar1 = 1;
    bVar2 = 0;
    goto LAB_0036b492;
  case 4:
  case kTaproot:
    hash_type_00 = kP2wpkh;
    bVar2 = 0;
    break;
  default:
    value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x753;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
    cfd::core::logger::warn<>((CfdSourceLocation *)&value,"hashtype is illegal.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&value,"Failed to parameter. hashtype is illegal.",
               (allocator *)&sighash_bytes);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = 0;
LAB_0036b492:
  cfd::core::ByteData::ByteData(&key_data);
  if ((bool)(bVar2 | bVar1)) {
    bVar3 = cfd::capi::IsEmptyString(redeem_script);
    if (bVar3) {
      value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
      value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x75d;
      value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
      cfd::core::logger::warn<>((CfdSourceLocation *)&value,"redeem script is null or empty.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&value,"Failed to parameter. redeem script is null or empty.",
                 (allocator *)&sighash_bytes);
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&value);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)&sighash_bytes,redeem_script,(allocator *)local_b8);
    cfd::core::Script::Script((Script *)&value,&sighash_bytes);
    std::__cxx11::string::~string((string *)&sighash_bytes);
    cfd::core::Script::GetData((ByteData *)&sighash_bytes,(Script *)&value);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes);
    cfd::core::Script::~Script((Script *)&value);
  }
  else {
    bVar3 = cfd::capi::IsEmptyString(pubkey);
    if (bVar3) {
      value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
      value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x766;
      value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
      cfd::core::logger::warn<>((CfdSourceLocation *)&value,"pubkey is null or empty.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&value,"Failed to parameter. pubkey is null or empty.",
                 (allocator *)&sighash_bytes);
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&value);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)&value,pubkey,(allocator *)local_b8);
    cfd::core::Pubkey::Pubkey((Pubkey *)&sighash_bytes,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    cfd::core::Pubkey::GetData((ByteData *)&value,(Pubkey *)&sighash_bytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data,&value);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes);
  }
  cfd::core::ConfidentialValue::ConfidentialValue(&value);
  bVar3 = cfd::capi::IsEmptyString(value_commitment);
  if (bVar3) {
    AVar6 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
    local_b8._0_8_ = AVar6.amount_;
    local_b8[8] = AVar6.ignore_check_;
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&sighash_bytes,(Amount *)local_b8);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&sighash_bytes);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&sighash_bytes);
  }
  else {
    std::__cxx11::string::string((string *)local_b8,value_commitment,(allocator *)&local_80);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&sighash_bytes,(string *)local_b8);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&sighash_bytes);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&sighash_bytes);
    std::__cxx11::string::~string((string *)local_b8);
  }
  cfd::core::SigHashType::Create(&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  std::__cxx11::string::string((string *)local_b8,tx_hex_string,&local_12a);
  std::__cxx11::string::string((string *)&local_60,txid,&local_12b);
  cfd::core::Txid::Txid(&local_80,&local_60);
  cfd::api::ElementsTransactionApi::CreateSignatureHash
            (&sighash_bytes,&api,(string *)local_b8,&local_80,vout,&key_data,&value,hash_type_00,
             &sighashtype);
  cfd::core::Txid::~Txid(&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_b8);
  pcVar4 = cfd::capi::CreateString(&sighash_bytes);
  *sighash = pcVar4;
  std::__cxx11::string::~string((string *)&sighash_bytes);
  cfd::core::ConfidentialValue::~ConfidentialValue(&value);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data);
  return 0;
}

Assistant:

int CfdCreateConfidentialSighash(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    int hash_type, const char* pubkey, const char* redeem_script,
    int64_t value_satoshi, const char* value_commitment, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    ByteData key_data;
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      Script redeem_script_obj = Script(redeem_script);
      key_data = redeem_script_obj.GetData();
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      Pubkey pubkey_obj = Pubkey(pubkey);
      key_data = pubkey_obj.GetData();
    }

    ConfidentialValue value;
    if (IsEmptyString(value_commitment)) {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    } else {
      value = ConfidentialValue(value_commitment);
    }

    ElementsTransactionApi api;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    std::string sighash_bytes = api.CreateSignatureHash(
        std::string(tx_hex_string), Txid(std::string(txid)), vout, key_data,
        value, core_hash_type, sighashtype);
    *sighash = CreateString(sighash_bytes);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}